

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  uint uVar1;
  Type TVar2;
  internal *this;
  ostream *poVar3;
  char *pcVar4;
  int in_ECX;
  char *local_90;
  char *local_80;
  string local_38;
  TestPartResult *local_18;
  TestPartResult *result_local;
  ostream *os_local;
  
  local_18 = result;
  result_local = (TestPartResult *)os;
  this = (internal *)TestPartResult::file_name(result);
  uVar1 = TestPartResult::line_number(local_18);
  internal::FormatFileLocation_abi_cxx11_(&local_38,this,(char *)(ulong)uVar1,in_ECX);
  poVar3 = std::operator<<(os,(string *)&local_38);
  poVar3 = std::operator<<(poVar3," ");
  TVar2 = TestPartResult::type(local_18);
  if (TVar2 == kSuccess) {
    local_80 = "Success";
  }
  else {
    TVar2 = TestPartResult::type(local_18);
    if (TVar2 == kSkip) {
      local_90 = "Skipped";
    }
    else {
      TVar2 = TestPartResult::type(local_18);
      local_90 = "Non-fatal failure";
      if (TVar2 == kFatalFailure) {
        local_90 = "Fatal failure";
      }
    }
    local_80 = local_90;
  }
  poVar3 = std::operator<<(poVar3,local_80);
  poVar3 = std::operator<<(poVar3,":\n");
  pcVar4 = TestPartResult::message(local_18);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << internal::FormatFileLocation(result.file_name(),
                                            result.line_number())
            << " "
            << (result.type() == TestPartResult::kSuccess
                    ? "Success"
                    : result.type() == TestPartResult::kSkip
                          ? "Skipped"
                          : result.type() == TestPartResult::kFatalFailure
                                ? "Fatal failure"
                                : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}